

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_art.hpp
# Opt level: O1

optional<bool> __thiscall
unodb::detail::olc_impl_helpers::
remove_or_choose_subtree<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>,unodb::detail::olc_inode_4<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>>
          (olc_impl_helpers *this,
          olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
          *inode,byte key_byte,basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_> k,
          olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
          *db_instance,read_critical_section *parent_critical_section,
          read_critical_section *node_critical_section,
          in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
          *node_in_parent,
          in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
          **child_in_parent,read_critical_section *child_critical_section,node_type *child_type,
          olc_node_ptr *child)

{
  atomic<long> *paVar1;
  long *plVar2;
  in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_> *piVar3;
  long lVar4;
  uintptr_t uVar5;
  undefined8 uVar6;
  long *plVar7;
  long lVar8;
  long lVar9;
  __int_type _Var10;
  __int_type _Var11;
  in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_> *piVar12;
  in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_> *piVar13;
  in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_> *piVar14;
  uint uVar15;
  write_guard wVar16;
  write_guard wVar17;
  bool bVar18;
  byte child_to_delete;
  ushort uVar19;
  int iVar20;
  ulong uVar21;
  pthread_t pVar22;
  basic_node_ptr<unodb::detail::olc_node_header> bVar23;
  uint uVar24;
  ulong uVar25;
  undefined7 in_register_00000011;
  ulong __n;
  db_type *db_instance_00;
  ushort uVar26;
  optimistic_lock *poVar27;
  undefined1 auVar28 [16];
  __atomic_base<unsigned_long> local_78;
  write_guard node_guard;
  write_guard local_50;
  write_guard child_guard_1;
  write_guard node_guard_1;
  write_guard child_guard;
  
  db_instance_00 = k.field_0._8_8_;
  uVar25 = k.field_0._0_8_;
  auVar28[0] = SUB81(inode,0);
  auVar28[1] = auVar28[0];
  auVar28[2] = auVar28[0];
  auVar28[3] = auVar28[0];
  auVar28[4] = auVar28[0];
  auVar28[5] = auVar28[0];
  auVar28[6] = auVar28[0];
  auVar28[7] = auVar28[0];
  auVar28[8] = auVar28[0];
  auVar28[9] = auVar28[0];
  auVar28[10] = auVar28[0];
  auVar28[0xb] = auVar28[0];
  auVar28[0xc] = auVar28[0];
  auVar28[0xd] = auVar28[0];
  auVar28[0xe] = auVar28[0];
  auVar28[0xf] = auVar28[0];
  auVar28 = vpcmpeqb_avx(auVar28,ZEXT416(*(uint *)(this + 0x24)));
  uVar24 = (uint)(ushort)((ushort)(SUB161(auVar28 >> 7,0) & 1) |
                          (ushort)(SUB161(auVar28 >> 0xf,0) & 1) << 1 |
                          (ushort)(SUB161(auVar28 >> 0x17,0) & 1) << 2 |
                          (ushort)(SUB161(auVar28 >> 0x1f,0) & 1) << 3 |
                          (ushort)(SUB161(auVar28 >> 0x27,0) & 1) << 4 |
                          (ushort)(SUB161(auVar28 >> 0x2f,0) & 1) << 5 |
                          (ushort)(SUB161(auVar28 >> 0x37,0) & 1) << 6 |
                          (ushort)(SUB161(auVar28 >> 0x3f,0) & 1) << 7 |
                          (ushort)(SUB161(auVar28 >> 0x47,0) & 1) << 8 |
                          (ushort)(SUB161(auVar28 >> 0x4f,0) & 1) << 9 |
                          (ushort)(SUB161(auVar28 >> 0x57,0) & 1) << 10 |
                          (ushort)(SUB161(auVar28 >> 0x5f,0) & 1) << 0xb |
                          (ushort)(SUB161(auVar28 >> 0x67,0) & 1) << 0xc |
                          (ushort)(SUB161(auVar28 >> 0x6f,0) & 1) << 0xd |
                          (ushort)(SUB161(auVar28 >> 0x77,0) & 1) << 0xe |
                         (ushort)(byte)(auVar28[0xf] >> 7) << 0xf) &
           ~(-1 << ((byte)this[0x20] & 0x1f));
  uVar15 = 0;
  if (uVar24 != 0) {
    for (; (uVar24 >> uVar15 & 1) == 0; uVar15 = uVar15 + 1) {
    }
  }
  if (uVar24 == 0) {
    plVar7 = (long *)(db_instance->root_pointer_lock).version.version.
                     super___atomic_base<unsigned_long>._M_i;
    lVar8 = (db_instance->root_pointer_lock).read_lock_count.super___atomic_base<long>._M_i;
    if (plVar7[1] < 1) goto LAB_0016a559;
    lVar9 = *plVar7;
    if (lVar8 != lVar9) {
      LOCK();
      plVar2 = plVar7 + 1;
      lVar4 = *plVar2;
      *plVar2 = *plVar2 + -1;
      UNLOCK();
      if (SBORROW8(lVar4,1) != *plVar2 < 0) goto LAB_0016a53a;
      if (lVar8 != lVar9) {
        (db_instance->root_pointer_lock).version.version.super___atomic_base<unsigned_long>._M_i = 0
        ;
        goto LAB_0016a337;
      }
    }
    LOCK();
    plVar7 = plVar7 + 1;
    lVar4 = *plVar7;
    *plVar7 = *plVar7 + -1;
    UNLOCK();
    if (SBORROW8(lVar4,1) != *plVar7 < 0) goto LAB_0016a53a;
    (db_instance->root_pointer_lock).version.version.super___atomic_base<unsigned_long>._M_i = 0;
    if (lVar8 != lVar9) goto LAB_0016a337;
    poVar27 = parent_critical_section->lock;
    _Var10 = (parent_critical_section->version).version;
    if ((poVar27->read_lock_count).super___atomic_base<long>._M_i < 1) goto LAB_0016a559;
    _Var11 = (poVar27->version).version.super___atomic_base<unsigned_long>._M_i;
    if (_Var10 == _Var11) {
LAB_0016a109:
      LOCK();
      paVar1 = &poVar27->read_lock_count;
      lVar8 = (paVar1->super___atomic_base<long>)._M_i;
      (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1;
      UNLOCK();
      if (SBORROW8(lVar8,1) != (paVar1->super___atomic_base<long>)._M_i < 0) {
LAB_0016a53a:
        __assert_fail("old_value > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./optimistic_lock.hpp"
                      ,0x343,"void unodb::optimistic_lock::dec_read_lock_count() const");
      }
    }
    else {
      LOCK();
      paVar1 = &poVar27->read_lock_count;
      lVar8 = (paVar1->super___atomic_base<long>)._M_i;
      (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1;
      UNLOCK();
      if (SBORROW8(lVar8,1) != (paVar1->super___atomic_base<long>)._M_i < 0) goto LAB_0016a53a;
      if (_Var10 == _Var11) goto LAB_0016a109;
    }
    bVar18 = _Var10 == _Var11;
    parent_critical_section->lock = (optimistic_lock *)0x0;
LAB_0016a30f:
    uVar26 = (ushort)bVar18;
    uVar19 = 0;
  }
  else {
    *(undefined8 *)child_type = *(undefined8 *)(this + (ulong)uVar15 * 8 + 0x28);
    bVar18 = optimistic_lock::check
                       (parent_critical_section->lock,
                        (version_type)(parent_critical_section->version).version);
    if (bVar18) {
      optimistic_lock::try_read_lock((optimistic_lock *)&stack0xffffffffffffff88);
      *child_in_parent =
           (in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_> *)
           local_78._M_i;
      local_78._M_i = 0;
      child_in_parent[1] =
           (in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_> *)
           node_guard.lock;
      optimistic_lock::read_critical_section::~read_critical_section
                ((read_critical_section *)&stack0xffffffffffffff88);
      if (*child_in_parent !=
          (in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_> *)0x0
         ) {
        uVar6 = *(undefined8 *)child_type;
        *(byte *)&child_critical_section->lock = (byte)uVar6 & 7;
        if ((uVar6 & (I256|I48)) != LEAF) {
          (node_in_parent->value)._M_i.tagged_ptr = (uintptr_t)(this + (ulong)uVar15 * 8 + 0x28);
          plVar7 = (long *)(db_instance->root_pointer_lock).version.version.
                           super___atomic_base<unsigned_long>._M_i;
          lVar8 = (db_instance->root_pointer_lock).read_lock_count.super___atomic_base<long>._M_i;
          if (plVar7[1] < 1) goto LAB_0016a559;
          lVar9 = *plVar7;
          if (lVar8 == lVar9) {
LAB_0016a08d:
            LOCK();
            plVar7 = plVar7 + 1;
            lVar4 = *plVar7;
            *plVar7 = *plVar7 + -1;
            UNLOCK();
            if (SBORROW8(lVar4,1) != *plVar7 < 0) goto LAB_0016a53a;
          }
          else {
            LOCK();
            plVar2 = plVar7 + 1;
            lVar4 = *plVar2;
            *plVar2 = *plVar2 + -1;
            UNLOCK();
            if (SBORROW8(lVar4,1) != *plVar2 < 0) goto LAB_0016a53a;
            if (lVar8 == lVar9) goto LAB_0016a08d;
          }
          uVar26 = (ushort)(lVar8 == lVar9);
          (db_instance->root_pointer_lock).version.version.super___atomic_base<unsigned_long>._M_i =
               0;
LAB_0016a250:
          uVar19 = 1;
          goto LAB_0016a311;
        }
        uVar21 = (ulong)*(uint *)((uVar6 & 0xfffffffffffffff8) + 0x18);
        __n = uVar25;
        if (uVar21 < uVar25) {
          __n = uVar21;
        }
        iVar20 = bcmp((void *)CONCAT71(in_register_00000011,key_byte),
                      (void *)((uVar6 & 0xfffffffffffffff8) + 0x20),__n);
        if (iVar20 != 0 || uVar21 != uVar25) {
          plVar7 = (long *)(db_instance->root_pointer_lock).version.version.
                           super___atomic_base<unsigned_long>._M_i;
          lVar8 = (db_instance->root_pointer_lock).read_lock_count.super___atomic_base<long>._M_i;
          if (plVar7[1] < 1) goto LAB_0016a559;
          lVar9 = *plVar7;
          if (lVar8 != lVar9) {
            LOCK();
            plVar2 = plVar7 + 1;
            lVar4 = *plVar2;
            *plVar2 = *plVar2 + -1;
            UNLOCK();
            if (SBORROW8(lVar4,1) != *plVar2 < 0) goto LAB_0016a53a;
            if (lVar8 != lVar9) {
LAB_0016a4fd:
              (db_instance->root_pointer_lock).version.version.super___atomic_base<unsigned_long>.
              _M_i = 0;
              goto LAB_0016a337;
            }
          }
          LOCK();
          plVar7 = plVar7 + 1;
          lVar4 = *plVar7;
          *plVar7 = *plVar7 + -1;
          UNLOCK();
          if (SBORROW8(lVar4,1) != *plVar7 < 0) goto LAB_0016a53a;
          (db_instance->root_pointer_lock).version.version.super___atomic_base<unsigned_long>._M_i =
               0;
          if (lVar8 != lVar9) goto LAB_0016a337;
          poVar27 = parent_critical_section->lock;
          _Var10 = (parent_critical_section->version).version;
          if ((poVar27->read_lock_count).super___atomic_base<long>._M_i < 1) goto LAB_0016a559;
          _Var11 = (poVar27->version).version.super___atomic_base<unsigned_long>._M_i;
          if (_Var10 != _Var11) {
            LOCK();
            paVar1 = &poVar27->read_lock_count;
            lVar8 = (paVar1->super___atomic_base<long>)._M_i;
            (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1
            ;
            UNLOCK();
            if (SBORROW8(lVar8,1) != (paVar1->super___atomic_base<long>)._M_i < 0)
            goto LAB_0016a53a;
            if (_Var10 != _Var11) {
              parent_critical_section->lock = (optimistic_lock *)0x0;
              goto LAB_0016a337;
            }
          }
          LOCK();
          paVar1 = &poVar27->read_lock_count;
          lVar8 = (paVar1->super___atomic_base<long>)._M_i;
          (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1;
          UNLOCK();
          if (SBORROW8(lVar8,1) != (paVar1->super___atomic_base<long>)._M_i < 0) goto LAB_0016a53a;
          parent_critical_section->lock = (optimistic_lock *)0x0;
          if (_Var10 != _Var11) goto LAB_0016a337;
          piVar12 = *child_in_parent;
          piVar13 = child_in_parent[1];
          if ((long)piVar12[1].value._M_i.tagged_ptr < 1) {
LAB_0016a559:
            __assert_fail("read_lock_count.load(std::memory_order_acquire) > 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./optimistic_lock.hpp"
                          ,0x2f6,"bool unodb::optimistic_lock::check(version_type) const");
          }
          piVar14 = (in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
                     *)(piVar12->value)._M_i.tagged_ptr;
          if (piVar13 == piVar14) {
LAB_0016a2f3:
            LOCK();
            piVar12 = piVar12 + 1;
            uVar5 = (piVar12->value)._M_i.tagged_ptr;
            (piVar12->value)._M_i.tagged_ptr = (piVar12->value)._M_i.tagged_ptr - 1;
            UNLOCK();
            if (SBORROW8(uVar5,1) != (long)(piVar12->value)._M_i.tagged_ptr < 0) goto LAB_0016a53a;
          }
          else {
            LOCK();
            piVar3 = piVar12 + 1;
            uVar5 = (piVar3->value)._M_i.tagged_ptr;
            (piVar3->value)._M_i.tagged_ptr = (piVar3->value)._M_i.tagged_ptr - 1;
            UNLOCK();
            if (SBORROW8(uVar5,1) != (long)(piVar3->value)._M_i.tagged_ptr < 0) goto LAB_0016a53a;
            if (piVar13 == piVar14) goto LAB_0016a2f3;
          }
          bVar18 = piVar13 == piVar14;
          *child_in_parent =
               (in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
                *)0x0;
          goto LAB_0016a30f;
        }
        child_to_delete = -(uVar24 == 0) | (byte)uVar15;
        if (this[0x20] == (olc_impl_helpers)0x2) {
          bVar18 = optimistic_lock::try_upgrade_to_write_lock
                             ((optimistic_lock *)
                              (db_instance->root_pointer_lock).version.version.
                              super___atomic_base<unsigned_long>._M_i,
                              (version_type)
                              (db_instance->root_pointer_lock).read_lock_count.
                              super___atomic_base<long>._M_i);
          node_guard_1.lock = (optimistic_lock *)0x0;
          if (bVar18) {
            node_guard_1.lock =
                 (optimistic_lock *)
                 (db_instance->root_pointer_lock).version.version.super___atomic_base<unsigned_long>
                 ._M_i;
          }
          (db_instance->root_pointer_lock).version.version.super___atomic_base<unsigned_long>._M_i =
               0;
          if (node_guard_1.lock != (optimistic_lock *)0x0) {
            bVar18 = optimistic_lock::try_upgrade_to_write_lock
                               (parent_critical_section->lock,
                                (version_type)(parent_critical_section->version).version);
            child_guard_1.lock = (optimistic_lock *)0x0;
            if (bVar18) {
              child_guard_1.lock = parent_critical_section->lock;
            }
            parent_critical_section->lock = (optimistic_lock *)0x0;
            if (child_guard_1.lock != (optimistic_lock *)0x0) {
              bVar18 = optimistic_lock::try_upgrade_to_write_lock
                                 ((optimistic_lock *)*child_in_parent,
                                  (version_type)child_in_parent[1]);
              wVar17.lock = child_guard_1.lock;
              poVar27 = (optimistic_lock *)0x0;
              if (bVar18) {
                poVar27 = (optimistic_lock *)*child_in_parent;
              }
              *child_in_parent =
                   (in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
                    *)0x0;
              local_50.lock = poVar27;
              if (poVar27 != (optimistic_lock *)0x0) {
                local_78._M_i = (__int_type)db_instance_00;
                node_guard.lock = (optimistic_lock *)this;
                optimistic_lock::atomic_version_type::write_unlock_and_obsolete
                          (&(child_guard_1.lock)->version);
                pVar22 = pthread_self();
                wVar16.lock = local_50.lock;
                ((wVar17.lock)->obsoleter_thread)._M_thread = pVar22;
                child_guard_1.lock = (optimistic_lock *)0x0;
                optimistic_lock::atomic_version_type::write_unlock_and_obsolete
                          (&(local_50.lock)->version);
                ((wVar16.lock)->obsoleter_thread)._M_thread = pVar22;
                local_50.lock = (optimistic_lock *)0x0;
                bVar23 = olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
                         ::leave_last_child((olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
                                             *)node_guard.lock,child_to_delete,db_instance_00);
                node_critical_section->lock = (optimistic_lock *)bVar23.tagged_ptr;
                if (child_guard_1.lock != (optimistic_lock *)0x0) {
                  __assert_fail("!node_guard.active()",
                                "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./olc_art.hpp"
                                ,0x62e,
                                "static std::optional<bool> unodb::detail::olc_impl_helpers::remove_or_choose_subtree(INode &, std::byte, basic_art_key<Key>, olc_db<Key, Value> &, optimistic_lock::read_critical_section &, optimistic_lock::read_critical_section &, in_critical_section<olc_node_ptr> *, in_critical_section<olc_node_ptr> **, optimistic_lock::read_critical_section *, node_type *, olc_node_ptr *) [Key = std::span<const std::byte>, Value = std::span<const std::byte>, INode = unodb::detail::olc_inode_4<std::span<const std::byte>, std::span<const std::byte>>]"
                               );
                }
                if (local_50.lock != (optimistic_lock *)0x0) {
                  __assert_fail("!child_guard.active()",
                                "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./olc_art.hpp"
                                ,0x62f,
                                "static std::optional<bool> unodb::detail::olc_impl_helpers::remove_or_choose_subtree(INode &, std::byte, basic_art_key<Key>, olc_db<Key, Value> &, optimistic_lock::read_critical_section &, optimistic_lock::read_critical_section &, in_critical_section<olc_node_ptr> *, in_critical_section<olc_node_ptr> **, optimistic_lock::read_critical_section *, node_type *, olc_node_ptr *) [Key = std::span<const std::byte>, Value = std::span<const std::byte>, INode = unodb::detail::olc_inode_4<std::span<const std::byte>, std::span<const std::byte>>]"
                               );
                }
                (node_in_parent->value)._M_i.tagged_ptr = 0;
                std::
                unique_ptr<unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::db_inode_qsbr_deleter<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                ::~unique_ptr((unique_ptr<unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::db_inode_qsbr_deleter<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                               *)&stack0xffffffffffffff88);
                optimistic_lock::write_guard::~write_guard(&local_50);
                optimistic_lock::write_guard::~write_guard(&child_guard_1);
                optimistic_lock::write_guard::~write_guard(&node_guard_1);
                if (poVar27 != (optimistic_lock *)0x0) {
                  LOCK();
                  (db_instance_00->shrinking_inode_counts)._M_elems[0].
                  super___atomic_base<unsigned_long>._M_i =
                       (db_instance_00->shrinking_inode_counts)._M_elems[0].
                       super___atomic_base<unsigned_long>._M_i + 1;
                  UNLOCK();
                  uVar19 = 1;
                  uVar26 = 1;
                  goto LAB_0016a311;
                }
                goto LAB_0016a337;
              }
              optimistic_lock::write_guard::~write_guard(&local_50);
            }
            optimistic_lock::write_guard::~write_guard(&child_guard_1);
          }
          optimistic_lock::write_guard::~write_guard(&node_guard_1);
        }
        else {
          plVar7 = (long *)(db_instance->root_pointer_lock).version.version.
                           super___atomic_base<unsigned_long>._M_i;
          lVar8 = (db_instance->root_pointer_lock).read_lock_count.super___atomic_base<long>._M_i;
          if (plVar7[1] < 1) goto LAB_0016a559;
          lVar9 = *plVar7;
          if (lVar8 != lVar9) {
            LOCK();
            plVar2 = plVar7 + 1;
            lVar4 = *plVar2;
            *plVar2 = *plVar2 + -1;
            UNLOCK();
            if (SBORROW8(lVar4,1) != *plVar2 < 0) goto LAB_0016a53a;
            if (lVar8 != lVar9) goto LAB_0016a4fd;
          }
          LOCK();
          plVar7 = plVar7 + 1;
          lVar4 = *plVar7;
          *plVar7 = *plVar7 + -1;
          UNLOCK();
          if (SBORROW8(lVar4,1) != *plVar7 < 0) goto LAB_0016a53a;
          (db_instance->root_pointer_lock).version.version.super___atomic_base<unsigned_long>._M_i =
               0;
          if (lVar8 == lVar9) {
            bVar18 = optimistic_lock::try_upgrade_to_write_lock
                               (parent_critical_section->lock,
                                (version_type)(parent_critical_section->version).version);
            uVar26 = 0;
            local_78._M_i = 0;
            if (bVar18) {
              local_78._M_i = (__int_type)parent_critical_section->lock;
            }
            parent_critical_section->lock = (optimistic_lock *)0x0;
            if ((optimistic_lock *)local_78._M_i != (optimistic_lock *)0x0) {
              bVar18 = optimistic_lock::try_upgrade_to_write_lock
                                 ((optimistic_lock *)*child_in_parent,
                                  (version_type)child_in_parent[1]);
              poVar27 = (optimistic_lock *)0x0;
              if (bVar18) {
                poVar27 = (optimistic_lock *)*child_in_parent;
              }
              *child_in_parent =
                   (in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
                    *)0x0;
              node_guard_1.lock = poVar27;
              if (poVar27 != (optimistic_lock *)0x0) {
                optimistic_lock::atomic_version_type::write_unlock_and_obsolete(&poVar27->version);
                pVar22 = pthread_self();
                (poVar27->obsoleter_thread)._M_thread = pVar22;
                node_guard_1.lock = (optimistic_lock *)0x0;
                olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
                ::remove((olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
                          *)this,(char *)(ulong)child_to_delete);
                (node_in_parent->value)._M_i.tagged_ptr = 0;
              }
              uVar26 = (ushort)(poVar27 != (optimistic_lock *)0x0);
              optimistic_lock::write_guard::~write_guard(&node_guard_1);
            }
            optimistic_lock::write_guard::~write_guard((write_guard *)&stack0xffffffffffffff88);
            goto LAB_0016a250;
          }
        }
      }
    }
    else {
      parent_critical_section->lock = (optimistic_lock *)0x0;
    }
LAB_0016a337:
    uVar19 = 0;
    uVar26 = 0;
  }
LAB_0016a311:
  return (_Optional_base<bool,_true,_true>)(uVar19 | uVar26 << 8);
}

Assistant:

[[nodiscard]] std::optional<bool> olc_impl_helpers::remove_or_choose_subtree(
    INode& inode, std::byte key_byte, basic_art_key<Key> k,
    olc_db<Key, Value>& db_instance,
    optimistic_lock::read_critical_section& parent_critical_section,
    optimistic_lock::read_critical_section& node_critical_section,
    in_critical_section<olc_node_ptr>* node_in_parent,
    in_critical_section<olc_node_ptr>** child_in_parent,
    optimistic_lock::read_critical_section* child_critical_section,
    node_type* child_type, olc_node_ptr* child) {
  const auto [child_i, found_child]{inode.find_child(key_byte)};

  if (found_child == nullptr) {
    if (UNODB_DETAIL_UNLIKELY(!parent_critical_section.try_read_unlock()))
      return {};  // LCOV_EXCL_LINE
    if (UNODB_DETAIL_UNLIKELY(!node_critical_section.try_read_unlock()))
      return {};  // LCOV_EXCL_LINE

    return false;
  }

  *child = found_child->load();

  if (UNODB_DETAIL_UNLIKELY(!node_critical_section.check())) return {};

  auto& child_lock{node_ptr_lock(*child)};
  *child_critical_section = child_lock.try_read_lock();
  if (UNODB_DETAIL_UNLIKELY(child_critical_section->must_restart())) return {};

  *child_type = child->type();

  if (*child_type != node_type::LEAF) {
    *child_in_parent = found_child;
    if (UNODB_DETAIL_UNLIKELY(!parent_critical_section.try_read_unlock()))
      return {};  // LCOV_EXCL_LINE
    return true;
  }

  const auto* const leaf{child->ptr<olc_leaf_type<Key, Value>*>()};
  if (!leaf->matches(k)) {
    if (UNODB_DETAIL_UNLIKELY(!parent_critical_section.try_read_unlock()))
      return {};  // LCOV_EXCL_LINE
    if (UNODB_DETAIL_UNLIKELY(!node_critical_section.try_read_unlock()))
      return {};  // LCOV_EXCL_LINE
    if (UNODB_DETAIL_UNLIKELY(!child_critical_section->try_read_unlock()))
      return {};  // LCOV_EXCL_LINE

    return false;
  }

  const auto is_node_min_size{inode.is_min_size()};

  if (UNODB_DETAIL_LIKELY(!is_node_min_size)) {
    if (UNODB_DETAIL_UNLIKELY(!parent_critical_section.try_read_unlock()))
      return {};  // LCOV_EXCL_LINE

    const optimistic_lock::write_guard node_guard{
        std::move(node_critical_section)};
    if (UNODB_DETAIL_UNLIKELY(node_guard.must_restart())) return {};

    optimistic_lock::write_guard child_guard{
        std::move(*child_critical_section)};
    if (UNODB_DETAIL_UNLIKELY(child_guard.must_restart())) return {};

    child_guard.unlock_and_obsolete();

    inode.remove(child_i, db_instance);

    *child_in_parent = nullptr;
    return true;
  }

  UNODB_DETAIL_ASSERT(is_node_min_size);

  if constexpr (std::is_same_v<INode, olc_inode_4<Key, Value>>) {
    const optimistic_lock::write_guard parent_guard{
        std::move(parent_critical_section)};
    if (UNODB_DETAIL_UNLIKELY(parent_guard.must_restart())) return {};

    optimistic_lock::write_guard node_guard{std::move(node_critical_section)};
    if (UNODB_DETAIL_UNLIKELY(node_guard.must_restart())) return {};

    optimistic_lock::write_guard child_guard{
        std::move(*child_critical_section)};
    if (UNODB_DETAIL_UNLIKELY(child_guard.must_restart())) return {};

    auto current_node{olc_art_policy<Key, Value>::make_db_inode_reclaimable_ptr(
        &inode, db_instance)};
    node_guard.unlock_and_obsolete();
    child_guard.unlock_and_obsolete();
    *node_in_parent = current_node->leave_last_child(child_i, db_instance);

    UNODB_DETAIL_ASSERT(!node_guard.active());
    UNODB_DETAIL_ASSERT(!child_guard.active());

    *child_in_parent = nullptr;
  } else {
    auto smaller_node{INode::smaller_derived_type::create(db_instance, inode)};

    const optimistic_lock::write_guard parent_guard{
        std::move(parent_critical_section)};
    if (UNODB_DETAIL_UNLIKELY(parent_guard.must_restart())) return {};

    optimistic_lock::write_guard node_guard{std::move(node_critical_section)};
    if (UNODB_DETAIL_UNLIKELY(node_guard.must_restart())) return {};

    optimistic_lock::write_guard child_guard{
        std::move(*child_critical_section)};
    if (UNODB_DETAIL_UNLIKELY(child_guard.must_restart())) return {};

    smaller_node->init(db_instance, inode, node_guard, child_i, child_guard);
    *node_in_parent = detail::olc_node_ptr{smaller_node.release(),
                                           INode::smaller_derived_type::type};

    UNODB_DETAIL_ASSERT(!node_guard.active());
    UNODB_DETAIL_ASSERT(!child_guard.active());

    *child_in_parent = nullptr;
  }

#ifdef UNODB_DETAIL_WITH_STATS
  db_instance.template account_shrinking_inode<INode::type>();
#endif  // UNODB_DETAIL_WITH_STATS

  return true;
}